

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

uint8_t * o_xattr(wchar_t oid)

{
  object_kind *poVar1;
  object_kind *kind;
  uint8_t *puStack_10;
  wchar_t oid_local;
  
  poVar1 = objkind_byid(oid);
  if (poVar1 == (object_kind *)0x0) {
    puStack_10 = (uint8_t *)0x0;
  }
  else if ((poVar1->flavor == (flavor *)0x0) || ((poVar1->aware & 1U) != 0)) {
    puStack_10 = kind_x_attr + poVar1->kidx;
  }
  else {
    puStack_10 = flavor_x_attr + poVar1->flavor->fidx;
  }
  return puStack_10;
}

Assistant:

static uint8_t *o_xattr(int oid)
{
	struct object_kind *kind = objkind_byid(oid);
	if (!kind) return NULL;

	if (!kind->flavor || kind->aware)
		return &kind_x_attr[kind->kidx];
	else
		return &flavor_x_attr[kind->flavor->fidx];
}